

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

ArgSlot __thiscall
Inline::MapActuals(Inline *this,Instr *callInstr,Instr **argOuts,ArgSlot formalCount,Func *inlinee,
                  ProfileId callSiteId,bool *stackArgsArgOutExpanded,Instr **argOutsExtra,
                  ArgSlot maxParamCount)

{
  undefined1 *puVar1;
  Func *this_00;
  Instr *pIVar2;
  Func *pFVar3;
  code *pcVar4;
  bool bVar5;
  ArgSlot AVar6;
  OpCode OVar7;
  ushort uVar8;
  int iVar9;
  int32 iVar10;
  uint uVar11;
  undefined4 *puVar12;
  SymOpnd *pSVar13;
  StackSym *this_01;
  JITTimeFunctionBody *this_02;
  StackSym *sym;
  undefined4 extraout_var;
  AddrOpnd *this_03;
  Instr *pIVar14;
  IntConstOpnd *pIVar15;
  Instr **ppIVar16;
  RegOpnd *pRVar17;
  undefined6 in_register_0000000a;
  ushort uVar18;
  ulong uVar19;
  uint currentFormal;
  uint uVar20;
  Opnd *this_04;
  ArgSlot i;
  int local_84;
  Func *local_80;
  ulong local_78;
  ulong local_70;
  Inline *local_68;
  Instr **local_60;
  Instr *local_58;
  undefined4 *local_50;
  uint local_48;
  undefined4 local_44;
  ulong local_40;
  ProfileId local_36;
  uint local_34;
  ProfileId callSiteId_local;
  
  local_44 = (undefined4)CONCAT62(in_register_0000000a,formalCount);
  local_60 = argOuts;
  local_58 = callInstr;
  local_36 = callSiteId;
  if (maxParamCount < formalCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x130d,"(formalCount <= maxParamCount)","formalCount <= maxParamCount");
    if (!bVar5) goto LAB_00504479;
    *puVar12 = 0;
  }
  this_04 = local_58->m_src2;
  *stackArgsArgOutExpanded = false;
  local_48 = this->currentInlineeFrameSlot;
  if (inlinee != (Func *)0x0) {
    bVar5 = GetInlineeHasArgumentObject(this,inlinee);
    Func::SetHasUnoptimizedArgumentsAccess(inlinee,bVar5);
  }
  bVar5 = IR::Opnd::IsSymOpnd(this_04);
  local_40 = 0;
  local_70 = (ulong)(ushort)local_44;
  if (bVar5) {
    local_48 = local_48 + 2;
    local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    local_78 = (ulong)callSiteId;
    uVar20 = 0;
    local_80 = inlinee;
    local_68 = this;
    do {
      pFVar3 = local_80;
      bVar5 = IR::Opnd::IsSymOpnd(this_04);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = local_50;
        *local_50 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1321,"(linkOpnd->IsSymOpnd())","linkOpnd->IsSymOpnd()");
        if (!bVar5) goto LAB_00504479;
        *puVar12 = 0;
      }
      pSVar13 = IR::Opnd::AsSymOpnd(this_04);
      this_01 = Sym::AsStackSym(pSVar13->m_sym);
      puVar12 = local_50;
      if ((this_01->field_0x18 & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1324,"(sym->m_isSingleDef)","sym->m_isSingleDef");
        if (!bVar5) goto LAB_00504479;
        *puVar12 = 0;
      }
      bVar5 = StackSym::IsArgSlotSym(this_01);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1325,"(sym->IsArgSlotSym())","sym->IsArgSlotSym()");
        if (!bVar5) goto LAB_00504479;
        *puVar12 = 0;
      }
      this_01->field_0x19 = this_01->field_0x19 | 0x40;
      this_00 = this->topFunc;
      AVar6 = StackSym::GetArgSlotNum(this_01);
      Func::SetArgOffset(this_00,this_01,(AVar6 + local_48) * 8);
      pIVar2 = (this_01->field_5).m_instrDef;
      OVar7 = pIVar2->m_opcode;
      local_34 = uVar20;
      if ((pFVar3 == (Func *)0x0) || (OVar7 != ArgOut_A)) {
        if (pFVar3 != (Func *)0x0) goto LAB_00503ec7;
      }
      else {
        if ((pFVar3->field_0x241 & 4) == 0) {
          pIVar2->m_opcode = ArgOut_A_Inline;
        }
        this_02 = Func::GetJITFunctionBody(pFVar3);
        bVar5 = JITTimeFunctionBody::IsAsmJsMode(this_02);
        if (!bVar5) {
          IR::Instr::GenerateBytecodeArgOutCapture(pIVar2);
        }
        OVar7 = pIVar2->m_opcode;
LAB_00503ec7:
        if (OVar7 == ArgOut_A_FromStackArgs) {
          for (uVar20 = 1; uVar20 < (uint)local_70; uVar20 = uVar20 + 1) {
            AVar6 = StackSym::GetArgSlotNum(this_01);
            sym = StackSym::NewArgSlotSym(AVar6,pIVar2->m_func,TyVar);
            sym->field_0x19 = sym->field_0x19 | 0x40;
            pSVar13 = IR::SymOpnd::New(&sym->super_Sym,this_01->m_type,pIVar2->m_func);
            iVar9 = (*this->topFunc->m_scriptContextInfo->_vptr_ScriptContextInfo[1])();
            this_03 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar9),AddrOpndKindDynamicVar,
                                        this->topFunc,true,(Var)0x0);
            IR::Opnd::SetValueType(&this_03->super_Opnd,(ValueType)0x2);
            pIVar14 = IR::Instr::New(ArgOut_A_FixupForStackArgs,&pSVar13->super_Opnd,
                                     &this_03->super_Opnd,pIVar2->m_src2,pIVar2->m_func);
            IR::Instr::InsertBefore(pIVar2,pIVar14);
            IR::Instr::ReplaceSrc2(pIVar2,pIVar14->m_dst);
            StackSym::IncrementArgSlotNum(this_01);
            pFVar3 = pIVar2->m_func;
            AVar6 = StackSym::GetArgSlotNum(this_01);
            this = local_68;
            Func::SetArgOffset(pFVar3,this_01,(AVar6 + local_48) * 8);
            IR::Instr::GenerateArgOutSnapshot(pIVar14);
          }
          pIVar15 = IR::IntConstOpnd::New(local_78,TyUint16,pIVar2->m_func,false);
          IR::Instr::ReplaceSrc1(pIVar2,&pIVar15->super_Opnd);
          *stackArgsArgOutExpanded = true;
          local_40 = (ulong)(((int)local_40 + uVar20) - 1);
          local_34 = local_34 - 1;
        }
      }
      AVar6 = StackSym::GetArgSlotNum(this_01);
      uVar20 = local_34;
      uVar18 = AVar6 - 1;
      if (uVar18 < (ushort)local_44) {
        pIVar14 = pIVar2;
        if (0xe < uVar18) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = local_50;
          *local_50 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x1368,"(currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount)",
                             "currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount");
          if (!bVar5) goto LAB_00504479;
          *puVar12 = 0;
          uVar20 = local_34;
        }
LAB_0050404e:
        local_60[uVar18] = pIVar14;
      }
      else if (pIVar2->m_opcode != ArgOut_A_FromStackArgs) {
        if (0xf < uVar18) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = local_50;
          *local_50 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x136f,"(currentActual <= Js::InlineeCallInfo::MaxInlineeArgoutCount)"
                             ,"currentActual <= Js::InlineeCallInfo::MaxInlineeArgoutCount");
          if (!bVar5) goto LAB_00504479;
          *puVar12 = 0;
          this = local_68;
        }
        if ((argOutsExtra != (Instr **)0x0) &&
           (argOutsExtra[uVar18] = pIVar2, uVar18 < maxParamCount)) {
          pIVar14 = (Instr *)0x0;
          goto LAB_0050404e;
        }
      }
      uVar20 = uVar20 + 1;
      this_04 = pIVar2->m_src2;
      bVar5 = IR::Opnd::IsSymOpnd(this_04);
    } while (bVar5);
    uVar18 = (ushort)uVar20;
    if (0xf < uVar18) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = local_50;
      *local_50 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x137e,"(actualCount <= Js::InlineeCallInfo::MaxInlineeArgoutCount)",
                         "actualCount <= Js::InlineeCallInfo::MaxInlineeArgoutCount");
      if (!bVar5) goto LAB_00504479;
      *puVar12 = 0;
    }
    puVar12 = local_50;
    uVar8 = (ushort)local_44;
    if (uVar18 < (ushort)local_44) {
      uVar8 = uVar18;
    }
    ppIVar16 = local_60;
    local_34 = uVar20;
    for (uVar19 = 0; uVar8 != uVar19; uVar19 = uVar19 + 1) {
      if (ppIVar16[uVar19] == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1382,"(argOuts[i])","argOuts[i]");
        if (!bVar5) goto LAB_00504479;
        *puVar12 = 0;
        ppIVar16 = local_60;
      }
    }
    local_40 = (ulong)((int)local_40 - 1);
    uVar20 = local_34;
  }
  else {
    local_40 = 0xffffffffffffffff;
    uVar20 = 0;
  }
  AVar6 = (ArgSlot)uVar20;
  bVar5 = IR::Opnd::IsRegOpnd(this_04);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,4999,"(linkOpnd->IsRegOpnd())","linkOpnd->IsRegOpnd()");
    if (!bVar5) goto LAB_00504479;
    *puVar12 = 0;
  }
  pRVar17 = IR::Opnd::AsRegOpnd(this_04);
  if ((pRVar17->m_sym->field_0x18 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,5000,"(linkOpnd->AsRegOpnd()->m_sym->m_isSingleDef)",
                       "linkOpnd->AsRegOpnd()->m_sym->m_isSingleDef");
    if (!bVar5) goto LAB_00504479;
    *puVar12 = 0;
  }
  pRVar17 = IR::Opnd::AsRegOpnd(this_04);
  if (((pRVar17->m_sym->field_5).m_instrDef)->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x138a,"(startCallOpCode == Js::OpCode::StartCall)",
                       "startCallOpCode == Js::OpCode::StartCall");
    if (!bVar5) goto LAB_00504479;
    *puVar12 = 0;
  }
  if (*stackArgsArgOutExpanded == true) {
    pRVar17 = IR::Opnd::AsRegOpnd(this_04);
    pIVar15 = IR::Opnd::AsIntConstOpnd(((pRVar17->m_sym->field_5).m_instrDef)->m_src1);
    iVar10 = IR::IntConstOpnd::AsInt32(pIVar15);
    IR::IntConstOpnd::SetValue(pIVar15,(long)(iVar10 + (int)local_40));
    pIVar2 = local_58;
    Func::EnsureCallSiteToArgumentsOffsetFixupMap(local_58->m_func);
    bVar5 = JsUtil::
            BaseDictionary<unsigned_short,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(pIVar2->m_func->callSiteToArgumentsOffsetFixupMap,&local_36);
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x139a,
                         "(!(callInstr->m_func->callSiteToArgumentsOffsetFixupMap->ContainsKey(callSiteId)))"
                         ,
                         "!(callInstr->m_func->callSiteToArgumentsOffsetFixupMap->ContainsKey(callSiteId))"
                        );
      if (!bVar5) goto LAB_00504479;
      *puVar12 = 0;
    }
    local_84 = (int)local_40;
    JsUtil::
    BaseDictionary<unsigned_short,int,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_short,int,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<unsigned_short,int,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)local_58->m_func->callSiteToArgumentsOffsetFixupMap,&local_36,&local_84);
  }
  pRVar17 = IR::Opnd::AsRegOpnd(this_04);
  uVar11 = IR::Instr::GetArgOutCount((pRVar17->m_sym->field_5).m_instrDef,false);
  uVar19 = (ulong)(uVar20 & 0xffff);
  if (uVar11 != (uVar20 & 0xffff)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x139e,
                       "(linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetArgOutCount( false) == actualCount)"
                       ,
                       "linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetArgOutCount( false) == actualCount"
                      );
    if (!bVar5) {
LAB_00504479:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar12 = 0;
  }
  pRVar17 = IR::Opnd::AsRegOpnd(this_04);
  puVar1 = &pRVar17->m_sym->field_0x18;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x4000;
  for (; uVar19 < local_70; uVar19 = uVar19 + 1) {
    local_60[uVar19] = (Instr *)0x0;
  }
  if (*stackArgsArgOutExpanded != false) {
    AVar6 = local_58->m_func->actualCount;
  }
  return AVar6;
}

Assistant:

Js::ArgSlot
Inline::MapActuals(IR::Instr *callInstr, __out_ecount(maxParamCount) IR::Instr *argOuts[],
    Js::ArgSlot formalCount,
    Func* inlinee,
    Js::ProfileId callSiteId,
    bool *stackArgsArgOutExpanded,
    IR::Instr *argOutsExtra[],
    Js::ArgSlot maxParamCount /* = Js::InlineeCallInfo::MaxInlineeArgoutCount*/)
{
    AnalysisAssert(formalCount <= maxParamCount);

    IR::Opnd *linkOpnd = callInstr->GetSrc2();
    Js::ArgSlot actualCount = 0;

    *stackArgsArgOutExpanded = false;
    uint inlineeFrameSlot = currentInlineeFrameSlot + (Js::Constants::InlineeMetaArgCount - 1);
    uint fixupArgoutCount = 0;

    if (inlinee)
    {
        bool hasArgumentsAccess = this->GetInlineeHasArgumentObject(inlinee);
        inlinee->SetHasUnoptimizedArgumentsAccess(hasArgumentsAccess);
    }

    if (linkOpnd->IsSymOpnd())
    {
        IR::Instr *argInstr;
        do
        {
            Assert(linkOpnd->IsSymOpnd());
            StackSym *sym = linkOpnd->AsSymOpnd()->m_sym->AsStackSym();

            Assert(sym->m_isSingleDef);
            Assert(sym->IsArgSlotSym());
            sym->m_isInlinedArgSlot = true;
            this->topFunc->SetArgOffset(sym, (inlineeFrameSlot + sym->GetArgSlotNum()) * MachPtr);
            argInstr = sym->m_instrDef;
            if (argInstr->m_opcode == Js::OpCode::ArgOut_A)
            {
                if(inlinee)
                {
                    if (!inlinee->GetHasUnoptimizedArgumentsAccess())
                    {
                        // This allows us to markTemp the argOut source.
                        argInstr->m_opcode = Js::OpCode::ArgOut_A_Inline;
                    }
                    if (!inlinee->GetJITFunctionBody()->IsAsmJsMode())
                    {
                        argInstr->GenerateBytecodeArgOutCapture();
                    }
                }
            }

            // Expand
            //
            // s31 ArgOut_A s32
            // s30 ArgOut_A_FromStackArgs s31
            //
            // to
            //
            // s31 ArgOut_A(_Inline) s32
            // sXX ArgOut_A_FixupForStackArgs s31
            // .
            // .
            // s34 ArgOut_A_FixupForStackArgs sXX
            // s30 ArgOut_A_FromStackArgs s34

            if (inlinee && argInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs)
            {
                IR::Instr * argFixupInstr;
                for(uint currentFormal = 1; currentFormal < formalCount; currentFormal++)
                {
                    StackSym* newStackSym = StackSym::NewArgSlotSym(sym->GetArgSlotNum(), argInstr->m_func);
                    newStackSym->m_isInlinedArgSlot = true;

                    IR::SymOpnd * newLinkOpnd = IR::SymOpnd::New(newStackSym, sym->GetType(), argInstr->m_func);
                    IR::Opnd * undefined = IR::AddrOpnd::New(this->topFunc->GetScriptContextInfo()->GetUndefinedAddr(),
                                                IR::AddrOpndKindDynamicVar, this->topFunc, true);
                    undefined->SetValueType(ValueType::Undefined);

                    argFixupInstr = IR::Instr::New(Js::OpCode::ArgOut_A_FixupForStackArgs, newLinkOpnd, undefined, argInstr->GetSrc2(), argInstr->m_func);
                    argInstr->InsertBefore(argFixupInstr);
                    argInstr->ReplaceSrc2(argFixupInstr->GetDst());
                    sym->IncrementArgSlotNum();
                    argInstr->m_func->SetArgOffset(sym, (inlineeFrameSlot + sym->GetArgSlotNum()) * MachPtr);

                    argFixupInstr->GenerateArgOutSnapshot();
                    fixupArgoutCount++;
                }
                // Now that the arguments object has been expanded, we don't require the sym corresponding to it.
                IR::IntConstOpnd* callSiteIdOpnd = IR::IntConstOpnd::New(callSiteId, TyUint16, argInstr->m_func);
                argInstr->ReplaceSrc1(callSiteIdOpnd);
                // Don't count ArgOut_A_FromStackArgs as an actual, when it has been expanded
                --actualCount;
                *stackArgsArgOutExpanded = true;
            }
            ++actualCount;
            const Js::ArgSlot currentActual = sym->GetArgSlotNum() - 1;
            if (currentActual < formalCount)
            {
                Assert(currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount);
                argOuts[currentActual] = argInstr;
            }

            // We don't want to treat ArgOut_A_FromStackArgs as an actual arg.
            else if (argInstr->m_opcode != Js::OpCode::ArgOut_A_FromStackArgs)
            {
                Assert(currentActual <= Js::InlineeCallInfo::MaxInlineeArgoutCount);
                if(argOutsExtra)
                {
                    argOutsExtra[currentActual] = argInstr;
                    if (currentActual < maxParamCount)
                    {
                        __analysis_assume(currentActual < Js::InlineeCallInfo::MaxInlineeArgoutCount);
                        argOuts[currentActual] = nullptr;
                    }
                }
            }
            linkOpnd = argInstr->GetSrc2();
        }
        while (linkOpnd->IsSymOpnd());
#if DBG
        Assert(actualCount <= Js::InlineeCallInfo::MaxInlineeArgoutCount);
        for(Js::ArgSlot i = 0; i < min(actualCount, formalCount); ++i)
        {
#pragma prefast(suppress:6001)
            Assert(argOuts[i]);
        }
#endif
    }

    Assert(linkOpnd->IsRegOpnd());
    Assert(linkOpnd->AsRegOpnd()->m_sym->m_isSingleDef);
    Js::OpCode startCallOpCode = linkOpnd->AsRegOpnd()->m_sym->m_instrDef->m_opcode;
    Assert(startCallOpCode == Js::OpCode::StartCall);

    // Update the count in StartCall to reflect
    //  1. ArgOut_A_FromStackArgs is not an actual once it has been expanded.
    //  2. The expanded argouts (from ArgOut_A_FromStackArgs).
    //
    // Note that the StartCall will reflect the formal count only as of now; the actual count would be set during MapFormals
    if(*stackArgsArgOutExpanded)
    {
        // TODO: Is an underflow here intended, it triggers on test\inlining\OS_2733280.js
        IR::IntConstOpnd * countOpnd = linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetSrc1()->AsIntConstOpnd();
        int32 count = countOpnd->AsInt32();
        count += fixupArgoutCount - 1;
        countOpnd->SetValue(count);

        callInstr->m_func->EnsureCallSiteToArgumentsOffsetFixupMap();
        Assert(!(callInstr->m_func->callSiteToArgumentsOffsetFixupMap->ContainsKey(callSiteId)));
        callInstr->m_func->callSiteToArgumentsOffsetFixupMap->Add(callSiteId, fixupArgoutCount - 1);
    }

    Assert(linkOpnd->AsRegOpnd()->m_sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ false) == actualCount);

    // Mark the StartCall's dst as an inlined arg slot as well so we know this is an inlined start call
    // and not adjust the stack height on x86
    linkOpnd->AsRegOpnd()->m_sym->m_isInlinedArgSlot = true;

    // Missing arguments...
    for (Js::ArgSlot i = actualCount; i < formalCount; i++)
    {
        argOuts[i] = nullptr;
    }

    // We may not know the exact number of actuals that "b" gets in a.b.apply just yet, since we have expanded the ArgOut_A_FromStackArgs based on the number of formals "b" accepts.
    // So, return the actualCount stored on the func if the ArgOut_A_FromStackArgs was expanded (and thus, the expanded argouts were accounted for in calculating the local actualCount)
    return *stackArgsArgOutExpanded ? callInstr->m_func->actualCount : actualCount;
}